

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O1

float get_active_coin_bias(float k,float avg_loss,float g,float c0)

{
  float __x;
  float fVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  
  dVar2 = log((double)k + 1.0);
  __x = (float)(((dVar2 + 0.0001) * (double)c0) / ((double)k + 0.0001));
  if (__x < 0.0) {
    fVar1 = sqrtf(__x);
  }
  else {
    fVar1 = SQRT(__x);
  }
  if (avg_loss <= 0.0) {
    avg_loss = 0.0;
  }
  if (1.0 <= avg_loss) {
    avg_loss = 1.0;
  }
  if (avg_loss < 0.0) {
    fVar4 = sqrtf(avg_loss);
  }
  else {
    fVar4 = SQRT(avg_loss);
  }
  fVar3 = avg_loss + g;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = fVar4 + fVar3;
  if (g <= fVar1 * fVar4 + __x) {
    fVar1 = 1.0;
  }
  else {
    fVar1 = fVar4 * fVar4 + g * 4.0;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = (fVar4 + fVar1) / (g + g);
    fVar1 = __x * fVar1 * fVar1;
  }
  return fVar1;
}

Assistant:

float get_active_coin_bias(float k, float avg_loss, float g, float c0)
{
  float b, sb, rs, sl;
  b = (float)(c0 * (log(k + 1.) + 0.0001) / (k + 0.0001));
  sb = sqrt(b);
  avg_loss = min(1.f, max(0.f, avg_loss));  // loss should be in [0,1]

  sl = sqrt(avg_loss) + sqrt(avg_loss + g);
  if (g <= sb * sl + b)
    return 1;
  rs = (sl + sqrt(sl * sl + 4 * g)) / (2 * g);
  return b * rs * rs;
}